

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.c
# Opt level: O3

int CpuFeatures_StringView_ParsePositiveNumber(StringView view)

{
  int iVar1;
  size_t sVar2;
  short *psVar3;
  StringView view_00;
  
  sVar2 = view.size;
  psVar3 = (short *)view.ptr;
  if (sVar2 == 0) {
    return -1;
  }
  if ((sVar2 != 1 && psVar3 != (short *)0x0) && (*psVar3 == 0x7830)) {
    view_00.ptr = psVar3 + 1;
    view_00.size = sVar2 - 2;
    iVar1 = ParsePositiveNumberWithBase(view_00,0x10);
    return iVar1;
  }
  iVar1 = ParsePositiveNumberWithBase(view,10);
  return iVar1;
}

Assistant:

int CpuFeatures_StringView_ParsePositiveNumber(const StringView view) {
  if (view.size) {
    const StringView hex_prefix = str("0x");
    if (CpuFeatures_StringView_StartsWith(view, hex_prefix)) {
      const StringView span_no_prefix =
          CpuFeatures_StringView_PopFront(view, hex_prefix.size);
      return ParsePositiveNumberWithBase(span_no_prefix, 16);
    }
    return ParsePositiveNumberWithBase(view, 10);
  }
  return -1;
}